

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall Catch::Approx::setMargin(Approx *this,double newMargin)

{
  ReusableStringStream local_38;
  string local_28;
  
  if (0.0 <= newMargin) {
    this->m_margin = newMargin;
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_38);
  std::operator<<(local_38.m_oss,"Invalid Approx::margin: ");
  std::ostream::_M_insert<double>(newMargin);
  std::operator<<(local_38.m_oss,'.');
  std::operator<<(local_38.m_oss," Approx::Margin has to be non-negative.");
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_28);
}

Assistant:

void Approx::setMargin(double newMargin) {
        CATCH_ENFORCE(newMargin >= 0,
            "Invalid Approx::margin: " << newMargin << '.'
            << " Approx::Margin has to be non-negative.");
        m_margin = newMargin;
    }